

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t
exr_attr_string_create_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  char *__dest;
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (s == (exr_attr_string_t *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid (NULL) arguments to string create with length");
      return eVar1;
    }
    eVar1 = exr_attr_string_init(ctxt,s,len);
    if (eVar1 == 0) {
      __dest = s->str;
      if (0 < len) {
        if (d == (char *)0x0) {
          memset(__dest,0,(ulong)(uint)len);
        }
        else {
          strncpy(__dest,d,(ulong)(uint)len);
        }
      }
      __dest[len] = '\0';
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_create_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    exr_result_t rv;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid (NULL) arguments to string create with length");

    rv = exr_attr_string_init (ctxt, s, len);
    if (rv == EXR_ERR_SUCCESS)
    {
        /* we know we own the string memory */
        char* outs = EXR_CONST_CAST (char*, s->str);
        /* someone might pass in a string shorter than requested length (or longer) */
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#elif defined(__GNUC__)
#    pragma GCC diagnostic push
#    pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
            if (d)
                strncpy (outs, d, (size_t) len);
            else
                memset (outs, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#elif defined(__GNUC__)
#    pragma GCC diagnostic pop
#endif
        }
        outs[len] = '\0';
    }
    return rv;
}